

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phrasalrule.cpp
# Opt level: O0

vector<jhu::thrax::PhrasalRule,_std::allocator<jhu::thrax::PhrasalRule>_> * __thiscall
jhu::thrax::(anonymous_namespace)::cat<jhu::thrax::PhrasalRule,5ul>
          (vector<jhu::thrax::PhrasalRule,_std::allocator<jhu::thrax::PhrasalRule>_>
           *__return_storage_ptr__,_anonymous_namespace_ *this,
          array<std::vector<jhu::thrax::PhrasalRule,_std::allocator<jhu::thrax::PhrasalRule>_>,_5UL>
          *vals)

{
  iterator pvVar1;
  iterator pvVar2;
  unsigned_long __n;
  iterator __first;
  iterator __last;
  back_insert_iterator<std::vector<jhu::thrax::PhrasalRule,_std::allocator<jhu::thrax::PhrasalRule>_>_>
  __result;
  value_type *v;
  iterator __end0;
  iterator __begin0;
  array<std::vector<jhu::thrax::PhrasalRule,_std::allocator<jhu::thrax::PhrasalRule>_>,_5UL>
  *__range3;
  unsigned_long sz;
  array<std::vector<jhu::thrax::PhrasalRule,_std::allocator<jhu::thrax::PhrasalRule>_>,_5UL>
  *vals_local;
  vector<jhu::thrax::PhrasalRule,_std::allocator<jhu::thrax::PhrasalRule>_> *result;
  
  pvVar1 = std::
           array<std::vector<jhu::thrax::PhrasalRule,_std::allocator<jhu::thrax::PhrasalRule>_>,_5UL>
           ::begin((array<std::vector<jhu::thrax::PhrasalRule,_std::allocator<jhu::thrax::PhrasalRule>_>,_5UL>
                    *)this);
  pvVar2 = std::
           array<std::vector<jhu::thrax::PhrasalRule,_std::allocator<jhu::thrax::PhrasalRule>_>,_5UL>
           ::end((array<std::vector<jhu::thrax::PhrasalRule,_std::allocator<jhu::thrax::PhrasalRule>_>,_5UL>
                  *)this);
  __n = std::
        accumulate<std::vector<jhu::thrax::PhrasalRule,std::allocator<jhu::thrax::PhrasalRule>>*,unsigned_long,jhu::thrax::(anonymous_namespace)::cat<jhu::thrax::PhrasalRule,5ul>(std::array<std::vector<jhu::thrax::PhrasalRule,std::allocator<jhu::thrax::PhrasalRule>>,5ul>&&)::_lambda(unsigned_long,auto:1_const&)_1_>
                  (pvVar1,pvVar2,0);
  std::vector<jhu::thrax::PhrasalRule,_std::allocator<jhu::thrax::PhrasalRule>_>::vector
            (__return_storage_ptr__);
  std::vector<jhu::thrax::PhrasalRule,_std::allocator<jhu::thrax::PhrasalRule>_>::reserve
            (__return_storage_ptr__,__n);
  __end0 = std::
           array<std::vector<jhu::thrax::PhrasalRule,_std::allocator<jhu::thrax::PhrasalRule>_>,_5UL>
           ::begin((array<std::vector<jhu::thrax::PhrasalRule,_std::allocator<jhu::thrax::PhrasalRule>_>,_5UL>
                    *)this);
  pvVar1 = std::
           array<std::vector<jhu::thrax::PhrasalRule,_std::allocator<jhu::thrax::PhrasalRule>_>,_5UL>
           ::end((array<std::vector<jhu::thrax::PhrasalRule,_std::allocator<jhu::thrax::PhrasalRule>_>,_5UL>
                  *)this);
  for (; __end0 != pvVar1; __end0 = __end0 + 1) {
    __first = std::vector<jhu::thrax::PhrasalRule,_std::allocator<jhu::thrax::PhrasalRule>_>::begin
                        (__end0);
    __last = std::vector<jhu::thrax::PhrasalRule,_std::allocator<jhu::thrax::PhrasalRule>_>::end
                       (__end0);
    __result = std::
               back_inserter<std::vector<jhu::thrax::PhrasalRule,std::allocator<jhu::thrax::PhrasalRule>>>
                         (__return_storage_ptr__);
    std::
    move<__gnu_cxx::__normal_iterator<jhu::thrax::PhrasalRule*,std::vector<jhu::thrax::PhrasalRule,std::allocator<jhu::thrax::PhrasalRule>>>,std::back_insert_iterator<std::vector<jhu::thrax::PhrasalRule,std::allocator<jhu::thrax::PhrasalRule>>>>
              ((__normal_iterator<jhu::thrax::PhrasalRule_*,_std::vector<jhu::thrax::PhrasalRule,_std::allocator<jhu::thrax::PhrasalRule>_>_>
                )__first._M_current,
               (__normal_iterator<jhu::thrax::PhrasalRule_*,_std::vector<jhu::thrax::PhrasalRule,_std::allocator<jhu::thrax::PhrasalRule>_>_>
                )__last._M_current,__result);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<T> cat(std::array<std::vector<T>, N>&& vals) {
  auto sz = std::accumulate(
      vals.begin(),
      vals.end(),
      size_t{0},
      [](size_t total, const auto& v) { return total + v.size(); });
  std::vector<T> result;
  result.reserve(sz);
  for (auto& v : vals) {
    std::move(v.begin(), v.end(), std::back_inserter(result));
  }
  return result;
}